

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_flags nk_convert(nk_context *ctx,nk_buffer *cmds,nk_buffer *vertices,nk_buffer *elements,
                   nk_convert_config *config)

{
  nk_draw_list *list;
  ushort uVar1;
  uint uVar2;
  nk_size nVar3;
  nk_draw_vertex_layout_element *pnVar4;
  nk_handle nVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  nk_anti_aliasing nVar21;
  nk_anti_aliasing nVar22;
  nk_anti_aliasing nVar23;
  nk_anti_aliasing nVar24;
  nk_command *cmd;
  nk_draw_list_stroke closed;
  nk_command_scissor *s;
  nk_color nVar25;
  int i_1;
  ulong uVar26;
  nk_vec2 pos;
  nk_vec2 a;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 center;
  nk_vec2 p0;
  nk_vec2 center_00;
  nk_vec2 a_00;
  nk_vec2 pos_02;
  nk_vec2 center_01;
  nk_vec2 a_01;
  nk_vec2 pos_03;
  nk_vec2 center_02;
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [16];
  nk_vec2 b;
  nk_vec2 cp0;
  nk_vec2 b_00;
  float fVar61;
  nk_vec2 b_01;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  nk_vec2 c;
  nk_vec2 cp1;
  nk_vec2 c_00;
  undefined1 auVar69 [16];
  nk_vec2 p1;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined2 uVar60;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2844,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2845,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (vertices == (nk_buffer *)0x0) {
    __assert_fail("vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2846,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (elements == (nk_buffer *)0x0) {
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2847,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2848,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_layout == (nk_draw_vertex_layout_element *)0x0) {
    __assert_fail("config->vertex_layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2849,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_size == 0) {
    __assert_fail("config->vertex_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x284a,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  (ctx->draw_list).buffer = cmds;
  nVar23 = config->line_AA;
  nVar24 = config->shape_AA;
  nVar3 = config->vertex_alignment;
  (ctx->draw_list).config.vertex_size = config->vertex_size;
  (ctx->draw_list).config.vertex_alignment = nVar3;
  pnVar4 = config->vertex_layout;
  (ctx->draw_list).config.null.uv = (config->null).uv;
  (ctx->draw_list).config.vertex_layout = pnVar4;
  uVar2 = config->curve_segment_count;
  nVar5 = (config->null).texture;
  (ctx->draw_list).config.arc_segment_count = config->arc_segment_count;
  (ctx->draw_list).config.curve_segment_count = uVar2;
  (ctx->draw_list).config.null.texture = nVar5;
  nVar21 = config->line_AA;
  nVar22 = config->shape_AA;
  uVar2 = config->circle_segment_count;
  (ctx->draw_list).config.global_alpha = config->global_alpha;
  (ctx->draw_list).config.line_AA = nVar21;
  (ctx->draw_list).config.shape_AA = nVar22;
  (ctx->draw_list).config.circle_segment_count = uVar2;
  (ctx->draw_list).elements = elements;
  (ctx->draw_list).vertices = vertices;
  (ctx->draw_list).line_AA = nVar23;
  (ctx->draw_list).shape_AA = nVar24;
  (ctx->draw_list).clip_rect = nk_null_rect;
  (ctx->draw_list).element_count = 0;
  (ctx->draw_list).vertex_count = 0;
  (ctx->draw_list).cmd_offset = 0;
  (ctx->draw_list).cmd_count = 0;
  list = &ctx->draw_list;
  (ctx->draw_list).path_count = 0;
  cmd = nk__begin(ctx);
  do {
    if (cmd == (nk_command *)0x0) {
      return (uint)(vertices->allocated < vertices->needed) * 4 +
             (uint)(((cmds->memory).size + cmds->allocated) - cmds->size < cmds->needed) * 2 +
             (uint)(elements->allocated < elements->needed) * 8;
    }
    switch(cmd->type) {
    case NK_COMMAND_SCISSOR:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar29._8_4_ = 0;
      auVar29._0_8_ = uVar26;
      auVar29._12_2_ = uVar60;
      auVar29._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar28._12_4_ = auVar29._12_4_;
      auVar28._8_2_ = 0;
      auVar28._0_8_ = uVar26;
      auVar28._10_2_ = uVar60;
      auVar27._10_6_ = auVar28._10_6_;
      auVar27._8_2_ = uVar60;
      auVar27._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar6._4_8_ = auVar27._8_8_;
      auVar6._2_2_ = uVar60;
      auVar6._0_2_ = uVar60;
      rect.x = (float)(int)(short)uVar26;
      rect.y = (float)(auVar6._0_4_ >> 0x10);
      uVar2 = *(uint *)&cmd[1].field_0x4;
      auVar62._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar62._4_2_ = (short)(uVar2 >> 0x10);
      auVar62._0_4_ = uVar2;
      rect.w = (float)(uVar2 & 0xffff);
      rect.h = (float)auVar62._4_4_;
      nk_draw_list_add_clip(list,rect);
      break;
    case NK_COMMAND_LINE:
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].type + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      a_00.x = (float)(auVar32._0_4_ >> 0x10);
      a_00.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = pshuflw(ZEXT416(*(uint *)&cmd[1].field_0x6),ZEXT416(*(uint *)&cmd[1].field_0x6),0x60
                       );
      b_00.x = (float)(auVar32._0_4_ >> 0x10);
      b_00.y = (float)(auVar32._4_4_ >> 0x10);
      nk_draw_list_stroke_line
                (list,a_00,b_00,*(nk_color *)((long)&cmd[1].next + 2),
                 (float)(ushort)(short)cmd[1].type);
      break;
    case NK_COMMAND_CURVE:
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].type + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      p0.x = (float)(auVar32._0_4_ >> 0x10);
      p0.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].next + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      cp0.x = (float)(auVar32._0_4_ >> 0x10);
      cp0.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].next + 6));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      cp1.x = (float)(auVar32._0_4_ >> 0x10);
      cp1.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = pshuflw(ZEXT416(*(uint *)&cmd[1].field_0x6),ZEXT416(*(uint *)&cmd[1].field_0x6),0x60
                       );
      p1.x = (float)(auVar32._0_4_ >> 0x10);
      p1.y = (float)(auVar32._4_4_ >> 0x10);
      nk_draw_list_stroke_curve
                (list,p0,cp0,cp1,p1,*(nk_color *)((long)&cmd[2].type + 2),
                 config->curve_segment_count,(float)(ushort)(short)cmd[1].type);
      break;
    case NK_COMMAND_RECT:
      auVar32 = pshuflw(ZEXT416(*(uint *)&cmd[1].field_0x4),ZEXT416(*(uint *)&cmd[1].field_0x4),0x60
                       );
      rect_03.x = (float)(auVar32._0_4_ >> 0x10);
      rect_03.y = (float)(auVar32._4_4_ >> 0x10);
      uVar26 = cmd[1].next;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar26;
      auVar19._12_2_ = (short)(uVar26 >> 0x30);
      auVar20._8_2_ = (short)(uVar26 >> 0x20);
      auVar20._0_8_ = uVar26;
      auVar20._10_4_ = auVar19._10_4_;
      auVar13._2_10_ = SUB1610(ZEXT616(auVar20._8_6_) << 0x40,6);
      auVar13._0_2_ = (short)(uVar26 >> 0x10);
      rect_03.w = (float)(ushort)uVar26;
      rect_03.h = (float)auVar13._0_4_;
      nk_draw_list_stroke_rect
                (list,rect_03,*(nk_color *)((long)&cmd[1].next + 4),
                 (float)(ushort)(short)cmd[1].type,
                 (float)(ushort)*(undefined2 *)((long)&cmd[1].type + 2));
      break;
    case NK_COMMAND_RECT_FILLED:
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].type + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      rect_01.x = (float)(auVar32._0_4_ >> 0x10);
      rect_01.y = (float)(auVar32._4_4_ >> 0x10);
      uVar2 = *(uint *)&cmd[1].field_0x6;
      auVar64._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar64._4_2_ = (short)(uVar2 >> 0x10);
      auVar64._0_4_ = uVar2;
      rect_01.w = (float)(uVar2 & 0xffff);
      rect_01.h = (float)auVar64._4_4_;
      nk_draw_list_fill_rect
                (list,rect_01,*(nk_color *)((long)&cmd[1].next + 2),
                 (float)(ushort)(short)cmd[1].type);
      break;
    case NK_COMMAND_RECT_MULTI_COLOR:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar50._8_4_ = 0;
      auVar50._0_8_ = uVar26;
      auVar50._12_2_ = uVar60;
      auVar50._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar49._12_4_ = auVar50._12_4_;
      auVar49._8_2_ = 0;
      auVar49._0_8_ = uVar26;
      auVar49._10_2_ = uVar60;
      auVar48._10_6_ = auVar49._10_6_;
      auVar48._8_2_ = uVar60;
      auVar48._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar15._4_8_ = auVar48._8_8_;
      auVar15._2_2_ = uVar60;
      auVar15._0_2_ = uVar60;
      rect_04.x = (float)(int)(short)uVar26;
      rect_04.y = (float)(auVar15._0_4_ >> 0x10);
      uVar2 = *(uint *)&cmd[1].field_0x4;
      auVar67._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar67._4_2_ = (short)(uVar2 >> 0x10);
      auVar67._0_4_ = uVar2;
      rect_04.w = (float)(uVar2 & 0xffff);
      rect_04.h = (float)auVar67._4_4_;
      nVar25.r = cmd[2].field_0x4;
      nVar25.g = cmd[2].field_0x5;
      nVar25.b = cmd[2].field_0x6;
      nVar25.a = cmd[2].field_0x7;
      nk_draw_list_fill_rect_multi_color
                (list,rect_04,*(nk_color *)&cmd[1].next,*(nk_color *)((long)&cmd[1].next + 4),nVar25
                 ,(nk_color)cmd[2].type);
      break;
    case NK_COMMAND_CIRCLE:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar53._8_4_ = 0;
      auVar53._0_8_ = uVar26;
      auVar53._12_2_ = uVar60;
      auVar53._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar52._12_4_ = auVar53._12_4_;
      auVar52._8_2_ = 0;
      auVar52._0_8_ = uVar26;
      auVar52._10_2_ = uVar60;
      auVar51._10_6_ = auVar52._10_6_;
      auVar51._8_2_ = uVar60;
      auVar51._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar16._4_8_ = auVar51._8_8_;
      auVar16._2_2_ = uVar60;
      auVar16._0_2_ = uVar60;
      uVar2 = *(uint *)&cmd[1].field_0x6;
      auVar68._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar68._4_2_ = (short)(uVar2 >> 0x10);
      auVar68._0_4_ = uVar2;
      fVar61 = (float)(uVar2 & 0xffff) * 0.5;
      center_01.x = (float)(int)(short)uVar26 + fVar61;
      center_01.y = (float)(auVar16._0_4_ >> 0x10) + (float)auVar68._4_4_ * 0.5;
      nk_draw_list_stroke_circle
                (list,center_01,fVar61,*(nk_color *)((long)&cmd[1].next + 2),
                 config->circle_segment_count,(float)*(ushort *)&cmd[1].field_0x4);
      break;
    case NK_COMMAND_CIRCLE_FILLED:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar26;
      auVar47._12_2_ = uVar60;
      auVar47._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar46._12_4_ = auVar47._12_4_;
      auVar46._8_2_ = 0;
      auVar46._0_8_ = uVar26;
      auVar46._10_2_ = uVar60;
      auVar45._10_6_ = auVar46._10_6_;
      auVar45._8_2_ = uVar60;
      auVar45._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar14._4_8_ = auVar45._8_8_;
      auVar14._2_2_ = uVar60;
      auVar14._0_2_ = uVar60;
      uVar2 = *(uint *)&cmd[1].field_0x4;
      auVar66._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar66._4_2_ = (short)(uVar2 >> 0x10);
      auVar66._0_4_ = uVar2;
      fVar61 = (float)(uVar2 & 0xffff) * 0.5;
      center_00.x = (float)(int)(short)uVar26 + fVar61;
      center_00.y = (float)(auVar14._0_4_ >> 0x10) + (float)auVar66._4_4_ * 0.5;
      nk_draw_list_fill_circle
                (list,center_00,fVar61,*(nk_color *)&cmd[1].next,config->circle_segment_count);
      break;
    case NK_COMMAND_ARC:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar56._8_4_ = 0;
      auVar56._0_8_ = uVar26;
      auVar56._12_2_ = uVar60;
      auVar56._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar55._12_4_ = auVar56._12_4_;
      auVar55._8_2_ = 0;
      auVar55._0_8_ = uVar26;
      auVar55._10_2_ = uVar60;
      auVar54._10_6_ = auVar55._10_6_;
      auVar54._8_2_ = uVar60;
      auVar54._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar17._4_8_ = auVar54._8_8_;
      auVar17._2_2_ = uVar60;
      auVar17._0_2_ = uVar60;
      pos_03.x = (float)(int)(short)uVar26;
      pos_03.y = (float)(auVar17._0_4_ >> 0x10);
      nk_draw_list_path_line_to(list,pos_03);
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar59._8_4_ = 0;
      auVar59._0_8_ = uVar26;
      auVar59._12_2_ = uVar60;
      auVar59._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar58._12_4_ = auVar59._12_4_;
      auVar58._8_2_ = 0;
      auVar58._0_8_ = uVar26;
      auVar58._10_2_ = uVar60;
      auVar57._10_6_ = auVar58._10_6_;
      auVar57._8_2_ = uVar60;
      auVar57._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar18._4_8_ = auVar57._8_8_;
      auVar18._2_2_ = uVar60;
      auVar18._0_2_ = uVar60;
      center_02.x = (float)(int)(short)uVar26;
      center_02.y = (float)(auVar18._0_4_ >> 0x10);
      nk_draw_list_path_arc_to
                (list,center_02,(float)*(ushort *)&cmd[1].field_0x4,*(float *)&cmd[1].next,
                 *(float *)((long)&cmd[1].next + 4),config->arc_segment_count);
      uVar1 = *(ushort *)&cmd[1].field_0x6;
      nVar25 = (nk_color)cmd[2].type;
      goto LAB_00122c0c;
    case NK_COMMAND_ARC_FILLED:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar38._8_4_ = 0;
      auVar38._0_8_ = uVar26;
      auVar38._12_2_ = uVar60;
      auVar38._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar37._12_4_ = auVar38._12_4_;
      auVar37._8_2_ = 0;
      auVar37._0_8_ = uVar26;
      auVar37._10_2_ = uVar60;
      auVar36._10_6_ = auVar37._10_6_;
      auVar36._8_2_ = uVar60;
      auVar36._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar10._4_8_ = auVar36._8_8_;
      auVar10._2_2_ = uVar60;
      auVar10._0_2_ = uVar60;
      pos_01.x = (float)(int)(short)uVar26;
      pos_01.y = (float)(auVar10._0_4_ >> 0x10);
      nk_draw_list_path_line_to(list,pos_01);
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar41._8_4_ = 0;
      auVar41._0_8_ = uVar26;
      auVar41._12_2_ = uVar60;
      auVar41._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar40._12_4_ = auVar41._12_4_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = uVar26;
      auVar40._10_2_ = uVar60;
      auVar39._10_6_ = auVar40._10_6_;
      auVar39._8_2_ = uVar60;
      auVar39._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar11._4_8_ = auVar39._8_8_;
      auVar11._2_2_ = uVar60;
      auVar11._0_2_ = uVar60;
      center.x = (float)(int)(short)uVar26;
      center.y = (float)(auVar11._0_4_ >> 0x10);
      nk_draw_list_path_arc_to
                (list,center,(float)*(ushort *)&cmd[1].field_0x4,*(float *)&cmd[1].next,
                 *(float *)((long)&cmd[1].next + 4),config->arc_segment_count);
      nVar25 = (nk_color)cmd[2].type;
      goto LAB_00122b18;
    case NK_COMMAND_TRIANGLE:
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].type + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      a_01.x = (float)(auVar32._0_4_ >> 0x10);
      a_01.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = pshuflw(ZEXT416(*(uint *)&cmd[1].field_0x6),ZEXT416(*(uint *)&cmd[1].field_0x6),0x60
                       );
      b_01.x = (float)(auVar32._0_4_ >> 0x10);
      b_01.y = (float)(auVar32._4_4_ >> 0x10);
      auVar32 = ZEXT416(*(uint *)((long)&cmd[1].next + 2));
      auVar32 = pshuflw(auVar32,auVar32,0x60);
      c_00.x = (float)(auVar32._0_4_ >> 0x10);
      c_00.y = (float)(auVar32._4_4_ >> 0x10);
      nk_draw_list_stroke_triangle
                (list,a_01,b_01,c_00,*(nk_color *)((long)&cmd[1].next + 6),
                 (float)(ushort)(short)cmd[1].type);
      break;
    case NK_COMMAND_TRIANGLE_FILLED:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar35._8_4_ = 0;
      auVar35._0_8_ = uVar26;
      auVar35._12_2_ = uVar60;
      auVar35._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._8_2_ = 0;
      auVar34._0_8_ = uVar26;
      auVar34._10_2_ = uVar60;
      auVar33._10_6_ = auVar34._10_6_;
      auVar33._8_2_ = uVar60;
      auVar33._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar8._4_8_ = auVar33._8_8_;
      auVar8._2_2_ = uVar60;
      auVar8._0_2_ = uVar60;
      a.x = (float)(int)(short)uVar26;
      a.y = (float)(auVar8._0_4_ >> 0x10);
      auVar32 = pshuflw(ZEXT416(*(uint *)&cmd[1].field_0x4),ZEXT416(*(uint *)&cmd[1].field_0x4),0x60
                       );
      b.x = (float)(auVar32._0_4_ >> 0x10);
      b.y = (float)(auVar32._4_4_ >> 0x10);
      uVar26 = cmd[1].next;
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar71._8_4_ = 0;
      auVar71._0_8_ = uVar26;
      auVar71._12_2_ = uVar60;
      auVar71._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar70._12_4_ = auVar71._12_4_;
      auVar70._8_2_ = 0;
      auVar70._0_8_ = uVar26;
      auVar70._10_2_ = uVar60;
      auVar69._10_6_ = auVar70._10_6_;
      auVar69._8_2_ = uVar60;
      auVar69._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar9._4_8_ = auVar69._8_8_;
      auVar9._2_2_ = uVar60;
      auVar9._0_2_ = uVar60;
      c.x = (float)(int)(short)uVar26;
      c.y = (float)(auVar9._0_4_ >> 0x10);
      nk_draw_list_fill_triangle(list,a,b,c,*(nk_color *)((long)&cmd[1].next + 4));
      break;
    case NK_COMMAND_POLYGON:
      for (uVar26 = 0; uVar26 < *(ushort *)&cmd[1].field_0x6; uVar26 = uVar26 + 1) {
        auVar32 = ZEXT416(*(uint *)((long)&cmd[1].next + uVar26 * 4));
        auVar32 = pshuflw(auVar32,auVar32,0x60);
        pos_00.x = (float)(auVar32._0_4_ >> 0x10);
        pos_00.y = (float)(auVar32._4_4_ >> 0x10);
        nk_draw_list_path_line_to(list,pos_00);
      }
      uVar1 = *(ushort *)&cmd[1].field_0x4;
      nVar25 = (nk_color)cmd[1].type;
LAB_00122c0c:
      closed = NK_STROKE_CLOSED;
LAB_00122c12:
      nk_draw_list_path_stroke(list,nVar25,closed,(float)uVar1);
      break;
    case NK_COMMAND_POLYGON_FILLED:
      for (uVar26 = 0; uVar26 < *(ushort *)&cmd[1].field_0x4; uVar26 = uVar26 + 1) {
        auVar32 = pshuflw(ZEXT416(*(uint *)(&cmd[1].field_0x6 + uVar26 * 4)),
                          ZEXT416(*(uint *)(&cmd[1].field_0x6 + uVar26 * 4)),0x60);
        pos_02.x = (float)(auVar32._0_4_ >> 0x10);
        pos_02.y = (float)(auVar32._4_4_ >> 0x10);
        nk_draw_list_path_line_to(list,pos_02);
      }
      nVar25 = (nk_color)cmd[1].type;
LAB_00122b18:
      nk_draw_list_path_fill(list,nVar25);
      break;
    case NK_COMMAND_POLYLINE:
      for (uVar26 = 0; uVar26 < *(ushort *)&cmd[1].field_0x6; uVar26 = uVar26 + 1) {
        auVar32 = ZEXT416(*(uint *)((long)&cmd[1].next + uVar26 * 4));
        auVar32 = pshuflw(auVar32,auVar32,0x60);
        pos.x = (float)(auVar32._0_4_ >> 0x10);
        pos.y = (float)(auVar32._4_4_ >> 0x10);
        nk_draw_list_path_line_to(list,pos);
      }
      uVar1 = *(ushort *)&cmd[1].field_0x4;
      nVar25 = (nk_color)cmd[1].type;
      closed = NK_STROKE_OPEN;
      goto LAB_00122c12;
    case NK_COMMAND_TEXT:
      uVar26 = *(ulong *)(cmd + 2);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar44._8_4_ = 0;
      auVar44._0_8_ = uVar26;
      auVar44._12_2_ = uVar60;
      auVar44._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._8_2_ = 0;
      auVar43._0_8_ = uVar26;
      auVar43._10_2_ = uVar60;
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._8_2_ = uVar60;
      auVar42._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar12._4_8_ = auVar42._8_8_;
      auVar12._2_2_ = uVar60;
      auVar12._0_2_ = uVar60;
      rect_02.x = (float)(int)(short)uVar26;
      rect_02.y = (float)(auVar12._0_4_ >> 0x10);
      uVar2 = *(uint *)&cmd[2].field_0x4;
      auVar65._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar65._4_2_ = (short)(uVar2 >> 0x10);
      auVar65._0_4_ = uVar2;
      rect_02.w = (float)(uVar2 & 0xffff);
      rect_02.h = (float)auVar65._4_4_;
      nk_draw_list_add_text
                (list,*(nk_user_font **)(cmd + 1),rect_02,(char *)(cmd + 3),
                 *(int *)((long)&cmd[2].next + 4),*(float *)&cmd[2].next,
                 *(nk_color *)((long)&cmd[1].next + 4));
      break;
    case NK_COMMAND_IMAGE:
      uVar26 = *(ulong *)(cmd + 1);
      uVar60 = (undefined2)(uVar26 >> 0x30);
      auVar31._8_4_ = 0;
      auVar31._0_8_ = uVar26;
      auVar31._12_2_ = uVar60;
      auVar31._14_2_ = uVar60;
      uVar60 = (undefined2)(uVar26 >> 0x20);
      auVar30._12_4_ = auVar31._12_4_;
      auVar30._8_2_ = 0;
      auVar30._0_8_ = uVar26;
      auVar30._10_2_ = uVar60;
      auVar32._10_6_ = auVar30._10_6_;
      auVar32._8_2_ = uVar60;
      auVar32._0_8_ = uVar26;
      uVar60 = (undefined2)(uVar26 >> 0x10);
      auVar7._4_8_ = auVar32._8_8_;
      auVar7._2_2_ = uVar60;
      auVar7._0_2_ = uVar60;
      rect_00.x = (float)(int)(short)uVar26;
      rect_00.y = (float)(auVar7._0_4_ >> 0x10);
      uVar2 = *(uint *)&cmd[1].field_0x4;
      auVar63._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
      auVar63._4_2_ = (short)(uVar2 >> 0x10);
      auVar63._0_4_ = uVar2;
      rect_00.w = (float)(uVar2 & 0xffff);
      rect_00.h = (float)auVar63._4_4_;
      nk_draw_list_add_image(list,*(nk_image *)&cmd[1].next,rect_00,(nk_color)cmd[3].type);
      break;
    case NK_COMMAND_CUSTOM:
      (**(code **)(cmd + 2))
                (list,(int)(short)cmd[1].type,(int)(short)*(undefined2 *)((long)&cmd[1].type + 2),
                 *(undefined2 *)&cmd[1].field_0x4,*(undefined2 *)&cmd[1].field_0x6,cmd[1].next);
    }
    cmd = nk__next(ctx,cmd);
  } while( true );
}

Assistant:

NK_API nk_flags
nk_convert(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *vertices, struct nk_buffer *elements,
    const struct nk_convert_config *config)
{
    nk_flags res = NK_CONVERT_SUCCESS;
    const struct nk_command *cmd;
    NK_ASSERT(ctx);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    NK_ASSERT(config);
    NK_ASSERT(config->vertex_layout);
    NK_ASSERT(config->vertex_size);
    if (!ctx || !cmds || !vertices || !elements || !config || !config->vertex_layout)
        return NK_CONVERT_INVALID_PARAM;

    nk_draw_list_setup(&ctx->draw_list, config, cmds, vertices, elements,
        config->line_AA, config->shape_AA);
    nk_foreach(cmd, ctx)
    {
#ifdef NK_INCLUDE_COMMAND_USERDATA
        ctx->draw_list.userdata = cmd->userdata;
#endif
        switch (cmd->type) {
        case NK_COMMAND_NOP: break;
        case NK_COMMAND_SCISSOR: {
            const struct nk_command_scissor *s = (const struct nk_command_scissor*)cmd;
            nk_draw_list_add_clip(&ctx->draw_list, nk_rect(s->x, s->y, s->w, s->h));
        } break;
        case NK_COMMAND_LINE: {
            const struct nk_command_line *l = (const struct nk_command_line*)cmd;
            nk_draw_list_stroke_line(&ctx->draw_list, nk_vec2(l->begin.x, l->begin.y),
                nk_vec2(l->end.x, l->end.y), l->color, l->line_thickness);
        } break;
        case NK_COMMAND_CURVE: {
            const struct nk_command_curve *q = (const struct nk_command_curve*)cmd;
            nk_draw_list_stroke_curve(&ctx->draw_list, nk_vec2(q->begin.x, q->begin.y),
                nk_vec2(q->ctrl[0].x, q->ctrl[0].y), nk_vec2(q->ctrl[1].x,
                q->ctrl[1].y), nk_vec2(q->end.x, q->end.y), q->color,
                config->curve_segment_count, q->line_thickness);
        } break;
        case NK_COMMAND_RECT: {
            const struct nk_command_rect *r = (const struct nk_command_rect*)cmd;
            nk_draw_list_stroke_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding, r->line_thickness);
        } break;
        case NK_COMMAND_RECT_FILLED: {
            const struct nk_command_rect_filled *r = (const struct nk_command_rect_filled*)cmd;
            nk_draw_list_fill_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding);
        } break;
        case NK_COMMAND_RECT_MULTI_COLOR: {
            const struct nk_command_rect_multi_color *r = (const struct nk_command_rect_multi_color*)cmd;
            nk_draw_list_fill_rect_multi_color(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->left, r->top, r->right, r->bottom);
        } break;
        case NK_COMMAND_CIRCLE: {
            const struct nk_command_circle *c = (const struct nk_command_circle*)cmd;
            nk_draw_list_stroke_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count, c->line_thickness);
        } break;
        case NK_COMMAND_CIRCLE_FILLED: {
            const struct nk_command_circle_filled *c = (const struct nk_command_circle_filled *)cmd;
            nk_draw_list_fill_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count);
        } break;
        case NK_COMMAND_ARC: {
            const struct nk_command_arc *c = (const struct nk_command_arc*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_stroke(&ctx->draw_list, c->color, NK_STROKE_CLOSED, c->line_thickness);
        } break;
        case NK_COMMAND_ARC_FILLED: {
            const struct nk_command_arc_filled *c = (const struct nk_command_arc_filled*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_fill(&ctx->draw_list, c->color);
        } break;
        case NK_COMMAND_TRIANGLE: {
            const struct nk_command_triangle *t = (const struct nk_command_triangle*)cmd;
            nk_draw_list_stroke_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color,
                t->line_thickness);
        } break;
        case NK_COMMAND_TRIANGLE_FILLED: {
            const struct nk_command_triangle_filled *t = (const struct nk_command_triangle_filled*)cmd;
            nk_draw_list_fill_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color);
        } break;
        case NK_COMMAND_POLYGON: {
            int i;
            const struct nk_command_polygon*p = (const struct nk_command_polygon*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_CLOSED, p->line_thickness);
        } break;
        case NK_COMMAND_POLYGON_FILLED: {
            int i;
            const struct nk_command_polygon_filled *p = (const struct nk_command_polygon_filled*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_fill(&ctx->draw_list, p->color);
        } break;
        case NK_COMMAND_POLYLINE: {
            int i;
            const struct nk_command_polyline *p = (const struct nk_command_polyline*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_OPEN, p->line_thickness);
        } break;
        case NK_COMMAND_TEXT: {
            const struct nk_command_text *t = (const struct nk_command_text*)cmd;
            nk_draw_list_add_text(&ctx->draw_list, t->font, nk_rect(t->x, t->y, t->w, t->h),
                t->string, t->length, t->height, t->foreground);
        } break;
        case NK_COMMAND_IMAGE: {
            const struct nk_command_image *i = (const struct nk_command_image*)cmd;
            nk_draw_list_add_image(&ctx->draw_list, i->img, nk_rect(i->x, i->y, i->w, i->h), i->col);
        } break;
        case NK_COMMAND_CUSTOM: {
            const struct nk_command_custom *c = (const struct nk_command_custom*)cmd;
            c->callback(&ctx->draw_list, c->x, c->y, c->w, c->h, c->callback_data);
        } break;
        default: break;
        }
    }
    res |= (cmds->needed > cmds->allocated + (cmds->memory.size - cmds->size)) ? NK_CONVERT_COMMAND_BUFFER_FULL: 0;
    res |= (vertices->needed > vertices->allocated) ? NK_CONVERT_VERTEX_BUFFER_FULL: 0;
    res |= (elements->needed > elements->allocated) ? NK_CONVERT_ELEMENT_BUFFER_FULL: 0;
    return res;
}